

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void Curl_ssl_delsessionid(connectdata *conn,void *ssl_sessionid)

{
  curl_ssl_session *session;
  curl_ssl_session *check;
  Curl_easy *data;
  size_t i;
  void *ssl_sessionid_local;
  connectdata *conn_local;
  
  data = (Curl_easy *)0x0;
  while( true ) {
    if ((Curl_easy *)(conn->data->set).general_ssl.max_ssl_sessions <= data) {
      return;
    }
    session = (conn->data->state).session + (long)data;
    if (session->sessionid == ssl_sessionid) break;
    data = (Curl_easy *)((long)&data->next + 1);
  }
  Curl_ssl_kill_session(session);
  return;
}

Assistant:

void Curl_ssl_delsessionid(struct connectdata *conn, void *ssl_sessionid)
{
  size_t i;
  struct Curl_easy *data=conn->data;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    struct curl_ssl_session *check = &data->state.session[i];

    if(check->sessionid == ssl_sessionid) {
      Curl_ssl_kill_session(check);
      break;
    }
  }
}